

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void fmp4_stream::gen_splice_insert
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out_splice_insert,
               int event_id,uint32_t duration,bool splice_immediate)

{
  byte bVar1;
  pointer puVar2;
  int k_1;
  ulong uVar3;
  undefined7 in_register_00000009;
  int k;
  pointer puVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> trailer;
  bitset<8UL> b2;
  
  base64_decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                (string *)base64splice_insert_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (out_splice_insert,
             &trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  puVar4 = (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000009,splice_immediate) != 0) {
    puVar4[2] = puVar4[2] + 0xff;
    puVar4[0xc] = puVar4[0xc] + 0xff;
  }
  *(uint *)(puVar4 + 0xe) =
       (uint)event_id >> 0x18 | (event_id & 0xff0000U) >> 8 | (event_id & 0xff00U) << 8 |
       event_id << 0x18;
  bVar1 = puVar4[0x13];
  b2.super__Base_bitset<1UL>._M_w._1_7_ = 0;
  b2.super__Base_bitset<1UL>._M_w._0_1_ = bVar1;
  trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&b2;
  trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4;
  std::bitset<8UL>::reference::operator=((reference *)&trailer,splice_immediate);
  puVar4[0x13] = (byte)b2.super__Base_bitset<1UL>._M_w;
  if (splice_immediate && (bVar1 & 0x40) != 0) {
    trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (puVar4 = (pointer)0x15;
        puVar2 = (out_splice_insert->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        puVar4 < (out_splice_insert->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish + ~(ulong)puVar2; puVar4 = puVar4 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&trailer,puVar4 + (long)puVar2);
    }
    if ((bVar1 & 0x20) != 0) {
      *(uint32_t *)
       (trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 1) =
           duration >> 0x18 | (duration & 0xff0000) >> 8 | (duration & 0xff00) << 8 |
           duration << 0x18;
    }
    for (uVar3 = 0;
        uVar3 < (ulong)((long)trailer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)trailer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start); uVar3 = uVar3 + 1) {
      (out_splice_insert->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
      .super__Vector_impl_data._M_start[uVar3 + 0x14] =
           trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (out_splice_insert,
               (long)(int)(~*(uint *)&(out_splice_insert->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                          *(int *)&(out_splice_insert->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&trailer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else if ((bVar1 & 0x20) != 0) {
    *(uint32_t *)(puVar4 + 0x16) =
         duration >> 0x18 | (duration & 0xff0000) >> 8 | (duration & 0xff00) << 8 | duration << 0x18
    ;
  }
  return;
}

Assistant:

void gen_splice_insert(std::vector<uint8_t> &out_splice_insert,int event_id, uint32_t duration, bool splice_immediate)
	{
		out_splice_insert = base64_decode(base64splice_insert);

		uint8_t *ptr = &out_splice_insert[0];
		if (splice_immediate)
		{
			*(ptr + 2) = *(ptr + 2) - 1;
		}

		ptr += 12;
		
		if (splice_immediate)
		{
			*(ptr ) = *(ptr) - 1;
		}

		ptr += 2;
		fmp4_write_uint32(event_id, (char *)ptr);
		ptr += 5;
		
		std::bitset<8> b2(*ptr);
		bool out_of_network_indicator = b2[7];
		bool program_splice_flag = b2[6];
		bool duration_flag = b2[5];
		bool splice_immediate_flag = b2[4];
		b2[4] = splice_immediate;
		*ptr = (unsigned char)b2.to_ulong();
		
		if (program_splice_flag && splice_immediate)
		{
			std::vector<uint8_t> trailer;
			for (int k = 21; k < out_splice_insert.size() - 1; k++)
			{
				trailer.push_back(out_splice_insert[k]);
			}
			ptr = &trailer[0];
			ptr++;
			if (duration_flag)
			{
				fmp4_write_uint32(duration, (const char*)ptr);
				ptr += 4;
			}
			for (int k = 0; k < trailer.size(); k++)
			{
				out_splice_insert[k + 20] = trailer[k];
			}
			int32_t or_size = out_splice_insert.size();
			out_splice_insert.resize(or_size - 1);
			return;
		}
		
		ptr+=3;
	
		if (duration_flag)
		{
			fmp4_write_uint32(duration, (const char *)ptr);
			ptr += 4;
		}
	
		//uint32_t crc = 0;
		//crc32_fmp4(&out_splice_insert[0], out_splice_insert.size() - 4, &crc);

		//ptr = &out_splice_insert[out_splice_insert.size() - 4];
		//fmp4_write_uint32(crc, (const char*)ptr);
		//uint32_t table[256];
		//crc::crc32::generate_table(table);

		//char* ptr2 = (char*)&out_splice_insert[0];
		//uint16_t slen = out_splice_insert.size() - 4;
		//printf("Size of Data struct is: %u\n", slen);                 // 16 bytes

		//uint32_t CRC = 0;
		//for (int cnt = 0; cnt < slen; cnt++) {
		//	CRC = crc::crc32::update(table, CRC, ptr2, 1);
		//	ptr2++;
		//}
		//// get the original crc
		//uint32_t or_crc = fmp4_read_uint32(ptr2);
		////fmp4_write_uint32(CRC, (char*)ptr2);
		//printf("Piece-wise crc32 of struct Data is: 0x%X \n", CRC);
	}